

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

LoginReply __thiscall World::LoginCheck(World *this,string *username,secure_string *password)

{
  bool bVar1;
  mapped_type *this_00;
  string *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  string local_148;
  undefined4 local_124;
  undefined1 local_120 [8];
  Database_Result res;
  allocator<char> local_c9;
  key_type local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  secure_string password_buffer;
  secure_string *password_local;
  string *username_local;
  World *this_local;
  
  password_buffer.str_.field_2._8_8_ = password;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"PasswordSalt",&local_c9);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(this->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_c8);
  util::variant::operator_cast_to_string(&local_a8,this_00);
  std::operator+(&local_88,&local_a8,username);
  psVar2 = util::secure_string::str_abi_cxx11_((secure_string *)password_buffer.str_.field_2._8_8_);
  std::operator+(&local_68,&local_88,psVar2);
  util::secure_string::secure_string((secure_string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  psVar2 = util::secure_string::str_abi_cxx11_((secure_string *)local_48);
  sha256((string *)&res.affected_rows,psVar2);
  util::secure_string::operator=
            ((secure_string *)password_buffer.str_.field_2._8_8_,(string *)&res.affected_rows);
  std::__cxx11::string::~string((string *)&res.affected_rows);
  util::secure_string::~secure_string((secure_string *)local_48);
  uVar3 = std::__cxx11::string::c_str();
  util::secure_string::str_abi_cxx11_((secure_string *)password_buffer.str_.field_2._8_8_);
  uVar4 = std::__cxx11::string::c_str();
  Database::Query((Database_Result *)local_120,&this->db,
                  "SELECT 1 FROM `accounts` WHERE `username` = \'$\' AND `password` = \'$\'",uVar3,
                  uVar4);
  bVar1 = std::
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
          ::empty((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                   *)local_120);
  if (bVar1) {
    this_local._6_2_ = LOGIN_WRONG_USERPASS;
  }
  else {
    std::__cxx11::string::string((string *)&local_148,(string *)username);
    bVar1 = PlayerOnline(this,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    if (bVar1) {
      this_local._6_2_ = LOGIN_LOGGEDIN;
    }
    else {
      this_local._6_2_ = LOGIN_OK;
    }
  }
  local_124 = 1;
  Database_Result::~Database_Result((Database_Result *)local_120);
  return this_local._6_2_;
}

Assistant:

LoginReply World::LoginCheck(const std::string& username, util::secure_string&& password)
{
	{
		util::secure_string password_buffer(std::move(std::string(this->config["PasswordSalt"]) + username + password.str()));
		password = sha256(password_buffer.str());
	}

	Database_Result res = this->db.Query("SELECT 1 FROM `accounts` WHERE `username` = '$' AND `password` = '$'", username.c_str(), password.str().c_str());

	if (res.empty())
	{
		return LOGIN_WRONG_USERPASS;
	}
	else if (this->PlayerOnline(username))
	{
		return LOGIN_LOGGEDIN;
	}
	else
	{
		return LOGIN_OK;
	}
}